

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPathShape.cpp
# Opt level: O2

void __thiscall
chrono::ChPathShape::ChPathShape(ChPathShape *this,shared_ptr<chrono::geometry::ChLinePath> *mpath)

{
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChPathShape_0118db00;
  std::__shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->gpath).
              super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>,
             &mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>);
  this->npoints = 200;
  return;
}

Assistant:

ChPathShape::ChPathShape(std::shared_ptr<geometry::ChLinePath>& mpath) : npoints(200), gpath(mpath) {}